

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSToken.cpp
# Opt level: O0

OSObject * __thiscall OSToken::createObject(OSToken *this)

{
  MutexLocker *pMVar1;
  undefined8 uVar2;
  _Rb_tree_const_iterator<OSObject_*> this_00;
  ObjectFile *this_01;
  undefined1 uVar3;
  long in_RDI;
  pair<std::_Rb_tree_const_iterator<OSObject_*>,_bool> pVar4;
  MutexLocker lock;
  ObjectFile *newObject;
  string lockPath;
  string objectPath;
  string objectUUID;
  Mutex *in_stack_fffffffffffffdd8;
  MutexLocker *in_stack_fffffffffffffde0;
  undefined7 in_stack_fffffffffffffde8;
  undefined1 in_stack_fffffffffffffdef;
  value_type *in_stack_fffffffffffffdf8;
  undefined7 in_stack_fffffffffffffe00;
  undefined1 in_stack_fffffffffffffe07;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe08;
  string local_1b0 [15];
  undefined1 in_stack_fffffffffffffe5f;
  string *in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe6c;
  string *in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe78;
  undefined7 in_stack_fffffffffffffe79;
  ObjectFile *in_stack_fffffffffffffe80;
  string local_148 [32];
  string local_128 [32];
  MutexLocker *local_108;
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [48];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  string local_30 [40];
  MutexLocker *local_8;
  
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    local_8 = (MutexLocker *)0x0;
  }
  else {
    UUID::newUUID_abi_cxx11_();
    std::operator+(in_stack_fffffffffffffe08,
                   (char *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffde0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8),
                   (char *)in_stack_fffffffffffffde0);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string(local_90);
    std::operator+(in_stack_fffffffffffffe08,
                   (char *)CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffde0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8),
                   (char *)in_stack_fffffffffffffde0);
    std::__cxx11::string::~string(local_e0);
    std::__cxx11::string::~string(local_100);
    pMVar1 = (MutexLocker *)operator_new(0xb0);
    std::__cxx11::string::string(local_128,local_50);
    std::__cxx11::string::string(local_148,local_c0);
    ObjectFile::ObjectFile
              (in_stack_fffffffffffffe80,
               (OSToken *)CONCAT71(in_stack_fffffffffffffe79,in_stack_fffffffffffffe78),
               in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,in_stack_fffffffffffffe60,
               (bool)in_stack_fffffffffffffe5f);
    std::__cxx11::string::~string(local_148);
    std::__cxx11::string::~string(local_128);
    local_108 = pMVar1;
    if (((ulong)pMVar1[6].mutex & 1) == 0) {
      uVar2 = std::__cxx11::string::c_str();
      softHSMLog(3,"createObject",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                 ,0x165,"Failed to create new object %s",uVar2);
      if (local_108 != (MutexLocker *)0x0) {
        (*local_108->_vptr_MutexLocker[1])();
      }
      local_8 = (MutexLocker *)0x0;
    }
    else {
      MutexLocker::MutexLocker(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
      std::set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>::insert
                ((set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_> *)
                 CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
                 in_stack_fffffffffffffdf8);
      pVar4 = std::set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_>::insert
                        ((set<OSObject_*,_std::less<OSObject_*>,_std::allocator<OSObject_*>_> *)
                         CONCAT17(in_stack_fffffffffffffe07,in_stack_fffffffffffffe00),
                         in_stack_fffffffffffffdf8);
      this_00 = pVar4.first._M_node;
      uVar3 = pVar4.second;
      this_01 = (ObjectFile *)(in_RDI + 0x90);
      ObjectFile::getFilename_abi_cxx11_(this_01);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT17(uVar3,in_stack_fffffffffffffe00),(value_type *)this_01);
      std::__cxx11::string::~string(local_1b0);
      uVar2 = std::__cxx11::string::c_str();
      pMVar1 = local_108;
      softHSMLog(7,"createObject",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/OSToken.cpp"
                 ,0x173,"(0x%08X) Created new object %s (0x%08X)",in_RDI,uVar2);
      Generation::update(*(Generation **)(in_RDI + 200));
      Generation::commit((Generation *)this_00._M_node);
      local_8 = local_108;
      MutexLocker::~MutexLocker(pMVar1);
    }
    std::__cxx11::string::~string(local_c0);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string(local_30);
  }
  return (OSObject *)local_8;
}

Assistant:

OSObject* OSToken::createObject()
{
	if (!valid) return NULL;

	// Generate a name for the object
	std::string objectUUID = UUID::newUUID();
	std::string objectPath = tokenPath + OS_PATHSEP + objectUUID + ".object";
	std::string lockPath = tokenPath + OS_PATHSEP + objectUUID + ".lock";

	// Create the new object file
	ObjectFile* newObject = new ObjectFile(this, objectPath, umask, lockPath, true);

	if (!newObject->valid)
	{
		ERROR_MSG("Failed to create new object %s", objectPath.c_str());

		delete newObject;

		return NULL;
	}

	// Now add it to the set of objects
	MutexLocker lock(tokenMutex);

	objects.insert(newObject);
	allObjects.insert(newObject);
	currentFiles.insert(newObject->getFilename());

	DEBUG_MSG("(0x%08X) Created new object %s (0x%08X)", this, objectPath.c_str(), newObject);

	gen->update();

	gen->commit();

	return newObject;
}